

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O1

void tnt_close(tnt_stream *s)

{
  tnt_stream_net *s_00;
  
  s_00 = (tnt_stream_net *)s->data;
  tnt_iob_clear(&s_00->sbuf);
  tnt_iob_clear(&s_00->rbuf);
  tnt_io_close(s_00);
  s->wrcnt = 0;
  s->reqid = 0;
  return;
}

Assistant:

void tnt_close(struct tnt_stream *s) {
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	tnt_iob_clear(&sn->sbuf);
	tnt_iob_clear(&sn->rbuf);
	tnt_io_close(sn);
	s->wrcnt = 0;
	s->reqid = 0;
}